

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O3

void PcodeCompile::matchSize
               (int4 j,OpTpl *op,bool inputonly,vector<OpTpl_*,_std::allocator<OpTpl_*>_> *ops)

{
  VarnodeTpl *pVVar1;
  pointer ppVVar2;
  uint uVar3;
  VarnodeTpl *pVVar4;
  OpTpl *pOVar5;
  ulong uVar6;
  bool bVar7;
  
  pOVar5 = op;
  if (j != -1) {
    pOVar5 = (OpTpl *)((op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>.
                       _M_impl.super__Vector_impl_data._M_start + j);
  }
  if ((inputonly) || (pVVar1 = op->output, pVVar1 == (VarnodeTpl *)0x0)) {
    pVVar4 = (VarnodeTpl *)0x0;
  }
  else {
    pVVar4 = (VarnodeTpl *)(pVVar1->size).value_real;
    if (pVVar4 != (VarnodeTpl *)0x0) {
      pVVar4 = pVVar1;
    }
    if ((pVVar1->size).type != real) {
      pVVar4 = pVVar1;
    }
  }
  ppVVar2 = (op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar7 = pVVar4 != (VarnodeTpl *)0x0;
  uVar3 = (uint)((ulong)((long)(op->input).
                               super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2) >> 3);
  if ((0 < (int)uVar3) && (pVVar4 == (VarnodeTpl *)0x0)) {
    uVar6 = 1;
    do {
      pVVar1 = ppVVar2[uVar6 - 1];
      pVVar4 = (VarnodeTpl *)(pVVar1->size).value_real;
      if (pVVar4 != (VarnodeTpl *)0x0) {
        pVVar4 = pVVar1;
      }
      if ((pVVar1->size).type != real) {
        pVVar4 = pVVar1;
      }
      bVar7 = pVVar4 != (VarnodeTpl *)0x0;
    } while ((uVar6 < (uVar3 & 0x7fffffff)) && (uVar6 = uVar6 + 1, pVVar4 == (VarnodeTpl *)0x0));
  }
  if (!bVar7) {
    return;
  }
  force_size(pOVar5->output,&pVVar4->size,ops);
  return;
}

Assistant:

void PcodeCompile::matchSize(int4 j,OpTpl *op,bool inputonly,const vector<OpTpl *> &ops)

{				// Find something to fill in zero size varnode
				// j is the slot we are trying to fill (-1=output)
				// Don't check output for non-zero if inputonly is true
  VarnodeTpl *match = (VarnodeTpl *)0;
  VarnodeTpl *vt;
  int4 i,inputsize;

  vt = (j==-1) ? op->getOut() : op->getIn(j);
  if (!inputonly) {
    if (op->getOut() != (VarnodeTpl *)0)
      if (!op->getOut()->isZeroSize())
	match = op->getOut();
  }
  inputsize = op->numInput();
  for(i=0;i<inputsize;++i) {
    if (match != (VarnodeTpl *)0) break;
    if (op->getIn(i)->isZeroSize()) continue;
    match = op->getIn(i);
  }
  if (match != (VarnodeTpl *)0)
    force_size(vt,match->getSize(),ops);
}